

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::anon_unknown_15::parseCommaSepArgs
               (int argc,char **argv,char *pattern,
               vector<doctest::String,_std::allocator<doctest::String>_> *res)

{
  char cVar1;
  bool bVar2;
  undefined1 extraout_AL;
  undefined1 uVar3;
  undefined1 extraout_AL_00;
  size_t sVar4;
  anon_union_24_2_13149d16_for_String_3 *value;
  char cVar5;
  size_t sVar6;
  String filtersString;
  anon_class_16_2_fa5d9a36 flush;
  ostringstream s;
  anon_union_24_2_13149d16_for_String_3 local_1d0;
  anon_class_16_2_fa5d9a36 local_1b8;
  anon_union_24_2_13149d16_for_String_3 local_1a8 [4];
  ios_base local_138 [264];
  
  value = &local_1d0;
  local_1d0.buf[0] = '\0';
  local_1d0.buf[0x17] = '\x17';
  local_1a8[0].buf[0] = '\0';
  local_1a8[0].buf[0x17] = '\x17';
  bVar2 = parseOption(argc,argv,pattern,(String *)&value->data,(String *)&local_1a8[0].data);
  uVar3 = bVar2;
  if (((char)local_1a8[0]._23_1_ < '\0') &&
     ((void *)CONCAT71(local_1a8[0]._1_7_,local_1a8[0].buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_1a8[0]._1_7_,local_1a8[0].buf[0]));
    uVar3 = extraout_AL;
  }
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8[0].data);
    if (local_1d0.buf[0x17] < '\0') {
      value = (anon_union_24_2_13149d16_for_String_3 *)CONCAT71(local_1d0._1_7_,local_1d0.buf[0]);
    }
    local_1b8.s = (ostringstream *)local_1a8;
    local_1b8.res = res;
    sVar4 = strlen(value->buf);
    if (sVar4 != 0) {
      sVar6 = 0;
      bVar2 = false;
      do {
        cVar1 = ((anon_union_24_2_13149d16_for_String_3 *)&(value->data).ptr)->buf[sVar6];
        cVar5 = (char)local_1a8;
        if (bVar2) {
          if ((cVar1 != '\\') && (cVar1 != ',')) {
            std::ostream::put(cVar5);
            bVar2 = false;
            goto LAB_0010e84c;
          }
          std::ostream::put(cVar5);
          bVar2 = false;
        }
        else {
LAB_0010e84c:
          if (cVar1 == '\\') {
            bVar2 = true;
          }
          else if (cVar1 == ',') {
            parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()(&local_1b8);
          }
          else {
            std::ostream::put(cVar5);
          }
        }
        sVar6 = sVar6 + 1;
      } while (sVar4 != sVar6);
      if (bVar2) {
        std::ostream::put((char)local_1a8);
      }
    }
    parseCommaSepArgs::anon_class_16_2_fa5d9a36::operator()(&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8[0].data);
    uVar3 = std::ios_base::~ios_base(local_138);
  }
  if ((local_1d0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_1d0._1_7_,local_1d0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_1d0._1_7_,local_1d0.buf[0]));
    uVar3 = extraout_AL_00;
  }
  return (bool)uVar3;
}

Assistant:

bool parseCommaSepArgs(int argc, const char* const* argv, const char* pattern,
                           std::vector<String>& res) {
        String filtersString;
        if(parseOption(argc, argv, pattern, &filtersString)) {
            // tokenize with "," as a separator, unless escaped with backslash
            std::ostringstream s;
            auto flush = [&s, &res]() {
                auto string = s.str();
                if(string.size() > 0) {
                    res.push_back(string.c_str());
                }
                s.str("");
            };

            bool seenBackslash = false;
            const char* current = filtersString.c_str();
            const char* end = current + strlen(current);
            while(current != end) {
                char character = *current++;
                if(seenBackslash) {
                    seenBackslash = false;
                    if(character == ',' || character == '\\') {
                        s.put(character);
                        continue;
                    }
                    s.put('\\');
                }
                if(character == '\\') {
                    seenBackslash = true;
                } else if(character == ',') {
                    flush();
                } else {
                    s.put(character);
                }
            }

            if(seenBackslash) {
                s.put('\\');
            }
            flush();
            return true;
        }
        return false;
    }